

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatSystem.cpp
# Opt level: O0

void __thiscall FatSystem::readFile(FatSystem *this,uint cluster,uint size,FILE *f,bool deleted)

{
  long lVar1;
  char *pcVar2;
  FatSystem *pFVar3;
  FILE *pFVar4;
  uint cluster_00;
  bool bVar5;
  uint uVar6;
  unsigned_long_long address;
  char *pcVar7;
  undefined1 *puVar8;
  size_t __size;
  char *local_58;
  bool local_49;
  FatSystem *local_48;
  unsigned_long_long local_40;
  unsigned_long __vla_expr0;
  uint local_2c;
  uint local_28;
  int toRead;
  int currentCluster;
  bool contiguous;
  bool deleted_local;
  FILE *f_local;
  uint size_local;
  uint cluster_local;
  FatSystem *this_local;
  
  __vla_expr0 = (unsigned_long)&local_58;
  local_48 = this;
  toRead._2_1_ = deleted;
  toRead._3_1_ = deleted;
  _currentCluster = (FILE *)f;
  f_local._0_4_ = size;
  f_local._4_4_ = cluster;
  _size_local = this;
  if (f == (FILE *)0x0) {
    _currentCluster = _stdout;
    __vla_expr0 = (unsigned_long)&local_58;
  }
  while (puVar8 = (undefined1 *)__vla_expr0, uVar6 = f_local._4_4_, pFVar3 = local_48,
        local_49 = (uint)f_local != 0 && f_local._4_4_ != 0xffffffff,
        (uint)f_local != 0 && f_local._4_4_ != 0xffffffff) {
    local_28 = f_local._4_4_;
    local_2c = (uint)f_local;
    if (local_48->bytesPerCluster < (ulong)(long)(int)(uint)f_local) {
      local_2c = (uint)local_48->bytesPerCluster;
    }
    local_40 = local_48->bytesPerCluster;
    lVar1 = -(local_40 + 0xf & 0xfffffffffffffff0);
    pcVar7 = puVar8 + lVar1;
    local_58 = pcVar7;
    __vla_expr0 = (unsigned_long)puVar8;
    pcVar7[-8] = -0x61;
    pcVar7[-7] = 'm';
    pcVar7[-6] = '\x12';
    pcVar7[-5] = '\0';
    pcVar7[-4] = '\0';
    pcVar7[-3] = '\0';
    pcVar7[-2] = '\0';
    pcVar7[-1] = '\0';
    address = clusterAddress(pFVar3,uVar6,false);
    uVar6 = local_2c;
    pFVar3 = local_48;
    pcVar2 = local_58;
    pcVar7[-8] = -0x4e;
    pcVar7[-7] = 'm';
    pcVar7[-6] = '\x12';
    pcVar7[-5] = '\0';
    pcVar7[-4] = '\0';
    pcVar7[-3] = '\0';
    pcVar7[-2] = '\0';
    pcVar7[-1] = '\0';
    readData(pFVar3,address,pcVar2,uVar6);
    pFVar4 = _currentCluster;
    pcVar2 = local_58;
    if ((uint)f_local != 0xffffffff) {
      f_local._0_4_ = (uint)f_local - local_2c;
    }
    __size = (size_t)(int)local_2c;
    pcVar7[-8] = -0x27;
    pcVar7[-7] = 'm';
    pcVar7[-6] = '\x12';
    pcVar7[-5] = '\0';
    pcVar7[-4] = '\0';
    pcVar7[-3] = '\0';
    pcVar7[-2] = '\0';
    pcVar7[-1] = '\0';
    fwrite(pcVar2,__size,1,pFVar4);
    pFVar4 = _currentCluster;
    pcVar7[-8] = -0x1e;
    pcVar7[-7] = 'm';
    pcVar7[-6] = '\x12';
    pcVar7[-5] = '\0';
    pcVar7[-4] = '\0';
    pcVar7[-3] = '\0';
    pcVar7[-2] = '\0';
    pcVar7[-1] = '\0';
    fflush(pFVar4);
    cluster_00 = f_local._4_4_;
    uVar6 = local_28;
    pFVar3 = local_48;
    if ((toRead._2_1_ & 1) == 0) {
      pcVar7[-8] = -0x7d;
      pcVar7[-7] = 'n';
      pcVar7[-6] = '\x12';
      pcVar7[-5] = '\0';
      pcVar7[-4] = '\0';
      pcVar7[-3] = '\0';
      pcVar7[-2] = '\0';
      pcVar7[-1] = '\0';
      f_local._4_4_ = nextCluster(pFVar3,uVar6,0);
      if (f_local._4_4_ == 0) {
        pcVar7[-8] = -0x5c;
        pcVar7[-7] = 'n';
        pcVar7[-6] = '\x12';
        pcVar7[-5] = '\0';
        pcVar7[-4] = '\0';
        pcVar7[-3] = '\0';
        pcVar7[-2] = '\0';
        pcVar7[-1] = '\0';
        fprintf(_stderr,
                "! One of your file\'s cluster is 0 (maybe FAT is broken, have a look to -2 and -m)\n"
               );
        pcVar7[-8] = -0x44;
        pcVar7[-7] = 'n';
        pcVar7[-6] = '\x12';
        pcVar7[-5] = '\0';
        pcVar7[-4] = '\0';
        pcVar7[-3] = '\0';
        pcVar7[-2] = '\0';
        pcVar7[-1] = '\0';
        fprintf(_stderr,"! Trying to enable contigous mode\n");
        toRead._2_1_ = 1;
        f_local._4_4_ = local_28 + 1;
      }
    }
    else if ((toRead._3_1_ & 1) == 0) {
      builtin_strncpy(puVar8 + lVar1 + -8,"\x1dn\x12",4);
      pcVar7[-4] = '\0';
      pcVar7[-3] = '\0';
      pcVar7[-2] = '\0';
      pcVar7[-1] = '\0';
      bVar5 = freeCluster(pFVar3,cluster_00);
      if (bVar5) {
        f_local._4_4_ = f_local._4_4_ + 1;
      }
      else {
        builtin_strncpy(puVar8 + lVar1 + -8,"9n\x12",4);
        pcVar7[-4] = '\0';
        pcVar7[-3] = '\0';
        pcVar7[-2] = '\0';
        pcVar7[-1] = '\0';
        fprintf(_stderr,"! Contiguous file contains cluster that seems allocated\n");
        builtin_strncpy(puVar8 + lVar1 + -8,"Qn\x12",4);
        pcVar7[-4] = '\0';
        pcVar7[-3] = '\0';
        pcVar7[-2] = '\0';
        pcVar7[-1] = '\0';
        fprintf(_stderr,"! Trying to disable contiguous mode\n");
        uVar6 = f_local._4_4_;
        pFVar3 = local_48;
        toRead._2_1_ = 0;
        builtin_strncpy(puVar8 + lVar1 + -8,"cn\x12",4);
        pcVar7[-4] = '\0';
        pcVar7[-3] = '\0';
        pcVar7[-2] = '\0';
        pcVar7[-1] = '\0';
        f_local._4_4_ = nextCluster(pFVar3,uVar6,0);
      }
    }
    else {
      do {
        pFVar3 = local_48;
        uVar6 = f_local._4_4_ + 1;
        f_local._4_4_ = uVar6;
        builtin_strncpy(puVar8 + lVar1 + -8,"\tn\x12",4);
        pcVar7[-4] = '\0';
        pcVar7[-3] = '\0';
        pcVar7[-2] = '\0';
        pcVar7[-1] = '\0';
        bVar5 = freeCluster(pFVar3,uVar6);
      } while (((bVar5 ^ 0xffU) & 1) != 0);
    }
  }
  return;
}

Assistant:

void FatSystem::readFile(unsigned int cluster, unsigned int size, FILE *f, bool deleted)
{
    bool contiguous = deleted;

    if (f == NULL) {
        f = stdout;
    }

    while ((size!=0) && cluster!=FAT_LAST) {
        int currentCluster = cluster;
        int toRead = size;
        if (toRead > bytesPerCluster || size < 0) {
            toRead = bytesPerCluster;
        }
#ifndef __WIN__
        char buffer[bytesPerCluster];
#else
                char *buffer = new char[bytesPerCluster];
                __try
                {
#endif
        readData(clusterAddress(cluster), buffer, toRead);

        if (size != -1) {
            size -= toRead;
        }

        // Write file data to the given file
        fwrite(buffer, toRead, 1, f);
        fflush(f);

        if (contiguous) {
            if (deleted) {
                do {
                    cluster++;
                } while (!freeCluster(cluster));
            } else {
                if (!freeCluster(cluster)) {
                    fprintf(stderr, "! Contiguous file contains cluster that seems allocated\n");
                    fprintf(stderr, "! Trying to disable contiguous mode\n");
                    contiguous = false;
                    cluster = nextCluster(cluster);
                } else {
                    cluster++;
                }
            }
        } else {
            cluster = nextCluster(currentCluster);

            if (cluster == 0) {
                fprintf(stderr, "! One of your file's cluster is 0 (maybe FAT is broken, have a look to -2 and -m)\n");
                fprintf(stderr, "! Trying to enable contigous mode\n");
                contiguous = true;
                cluster = currentCluster+1;
            }
        }
#ifdef __WIN__
    }
    __finally
    {
        delete[] buffer;
    }
#endif
    }
}